

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDCompressionState<double>::CreateEmptySegment
          (AlpRDCompressionState<double> *this,idx_t row_start)

{
  BlockManager *other;
  BufferManager *pBVar1;
  pointer pCVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  long in_RDI;
  idx_t in_stack_00000008;
  idx_t in_stack_00000010;
  LogicalType *in_stack_00000018;
  CompressionFunction *in_stack_00000020;
  DatabaseInstance *in_stack_00000028;
  BlockManager *in_stack_00000040;
  BufferManager *buffer_manager;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  LogicalType *type;
  DatabaseInstance *db;
  BufferHandle *in_stack_ffffffffffffff10;
  undefined1 local_58 [40];
  BufferManager *local_30;
  LogicalType *local_20;
  DatabaseInstance *local_18;
  
  local_18 = ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0xaba8c0);
  local_20 = ColumnDataCheckpointData::GetType((ColumnDataCheckpointData *)0xaba8dc);
  CompressionInfo::GetBlockSize((CompressionInfo *)0xaba92a);
  other = CompressionInfo::GetBlockManager((CompressionInfo *)(in_RDI + 8));
  ColumnSegment::CreateTransientSegment
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             in_stack_00000008,in_stack_00000040);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator=
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_stack_ffffffffffffff10,
             (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             other);
  pBVar1 = BufferManager::GetBufferManager((DatabaseInstance *)0xaba99c);
  local_30 = pBVar1;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff10);
  (*pBVar1->_vptr_BufferManager[7])(local_58,pBVar1,&pCVar2->block);
  BufferHandle::operator=(in_stack_ffffffffffffff10,(BufferHandle *)other);
  BufferHandle::~BufferHandle(in_stack_ffffffffffffff10);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xabaa36);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff10);
  iVar4 = ColumnSegment::GetBlockOffset(pCVar2);
  *(data_ptr_t *)(in_RDI + 0x60) = pdVar3 + (ulong)*(uint *)(in_RDI + 0x70) + 7 + iVar4;
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xabaa84);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff10);
  iVar4 = ColumnSegment::GetBlockOffset(pCVar2);
  pdVar3 = pdVar3 + iVar4;
  iVar4 = CompressionInfo::GetBlockSize((CompressionInfo *)0xabaace);
  *(data_ptr_t *)(in_RDI + 0x68) = pdVar3 + iVar4;
  *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x70) + 7;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xabab04);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		current_segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);

		// The pointer to the start of the compressed data.
		data_ptr = handle.Ptr() + current_segment->GetBlockOffset() + AlpRDConstants::HEADER_SIZE +
		           actual_dictionary_size_bytes;
		// The pointer to the start of the metadata.
		metadata_ptr = handle.Ptr() + current_segment->GetBlockOffset() + info.GetBlockSize();
		next_vector_byte_index_start = AlpRDConstants::HEADER_SIZE + actual_dictionary_size_bytes;
	}